

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

Array<kj::String> * __thiscall
kj::Array<kj::String>::operator=(Array<kj::String> *this,Array<kj::String> *other)

{
  Array<kj::String> *other_local;
  Array<kj::String> *this_local;
  
  dispose(this);
  this->ptr = other->ptr;
  this->size_ = other->size_;
  this->disposer = other->disposer;
  other->ptr = (String *)0x0;
  other->size_ = 0;
  return this;
}

Assistant:

inline Array& operator=(Array&& other) {
    dispose();
    ptr = other.ptr;
    size_ = other.size_;
    disposer = other.disposer;
    other.ptr = nullptr;
    other.size_ = 0;
    return *this;
  }